

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O3

int bit_encode_free(bit_encode_t *be)

{
  ushort uVar1;
  uint uVar2;
  
  uVar2 = 0;
  if (be != (bit_encode_t *)0x0) {
    uVar1 = be->refcount - 1;
    be->refcount = uVar1;
    if ((short)uVar1 < 1) {
      ckd_free(be);
      uVar2 = 0;
    }
    else {
      uVar2 = (uint)uVar1;
    }
  }
  return uVar2;
}

Assistant:

int
bit_encode_free(bit_encode_t *be)
{
    if (be == NULL)
        return 0;
    if (--be->refcount > 0)
        return be->refcount;
    ckd_free(be);

    return 0;
}